

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_memoryDumpOutput_Test::testBody
          (TEST_MemoryLeakDetectorTest_memoryDumpOutput_Test *this)

{
  MemoryLeakDetector *this_00;
  TestMemoryAllocator *allocator;
  char *pcVar1;
  UtestShell *pUVar2;
  undefined1 local_28 [8];
  SimpleString output;
  char *mem;
  TEST_MemoryLeakDetectorTest_memoryDumpOutput_Test *this_local;
  
  this_00 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  allocator = defaultNewAllocator();
  output.bufferSize_ = (size_t)MemoryLeakDetector::allocMemory(this_00,allocator,6,false);
  SimpleString::StrNCpy((char *)output.bufferSize_,"test1",6);
  pcVar1 = MemoryLeakDetector::report
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      mem_leak_period_checking);
  SimpleString::SimpleString((SimpleString *)local_28,pcVar1);
  pUVar2 = UtestShell::getCurrent();
  pcVar1 = SimpleString::asCharString((SimpleString *)local_28);
  (*pUVar2->_vptr_UtestShell[0xc])
            (pUVar2,"Alloc num (1)",pcVar1,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xa9);
  pUVar2 = UtestShell::getCurrent();
  pcVar1 = SimpleString::asCharString((SimpleString *)local_28);
  (*pUVar2->_vptr_UtestShell[0xc])
            (pUVar2,"Leak size: 6 Allocated at",pcVar1,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xaa);
  pUVar2 = UtestShell::getCurrent();
  pcVar1 = SimpleString::asCharString((SimpleString *)local_28);
  (*pUVar2->_vptr_UtestShell[0xc])
            (pUVar2,"Content:",pcVar1,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xab);
  pUVar2 = UtestShell::getCurrent();
  pcVar1 = SimpleString::asCharString((SimpleString *)local_28);
  (*pUVar2->_vptr_UtestShell[0xc])
            (pUVar2,"0000: 74 65 73 74 31 00                                |test1.|",pcVar1,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xac);
  (*PlatformSpecificFree)((void *)output.bufferSize_);
  SimpleString::~SimpleString((SimpleString *)local_28);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, memoryDumpOutput)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 6);
    SimpleString::StrNCpy(mem, "test1", 6);
    SimpleString output = detector->report(mem_leak_period_checking);

    STRCMP_CONTAINS("Alloc num (1)", output.asCharString());
    STRCMP_CONTAINS("Leak size: 6 Allocated at",  output.asCharString());
    STRCMP_CONTAINS("Content:",  output.asCharString());
    STRCMP_CONTAINS("0000: 74 65 73 74 31 00                                |test1.|", output.asCharString());

    PlatformSpecificFree(mem);
}